

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

CheckerInstantiationSyntax * __thiscall
slang::parsing::Parser::parseCheckerInstantiation(Parser *this,AttrList attributes)

{
  bool bVar1;
  NameSyntax *type;
  ParameterValueAssignmentSyntax *parameters;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar2;
  CheckerInstantiationSyntax *pCVar3;
  Info *pIVar4;
  Info *extraout_RDX;
  Info *pIVar5;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *attributes_00;
  TokenKind TVar6;
  ulong uVar7;
  TokenKind kind;
  Token current_00;
  Token TVar8;
  Token semi;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_178;
  ulong local_168;
  undefined8 uStack_160;
  size_t local_158;
  pointer local_150;
  size_t local_148;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  
  type = parseName(this,(bitmask<slang::parsing::detail::NameOptions>)0x40);
  parameters = parseParameterValueAssignment(this);
  Token::Token(&semi);
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  current_00 = ParserBase::peek(&this->super_ParserBase);
  current = current_00;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(current_00.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x400005,location);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleInstance(current_00.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,current_00,Semicolon,&semi,(DiagCode)0x400005);
      pIVar5 = extraout_RDX;
      goto LAB_001cc808;
    }
    do {
      do {
        pIVar5 = current_00.info;
        pHVar2 = parseHierarchicalInstance(this);
        local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar2;
        local_168 = CONCAT71(local_168._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_178._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar8.kind);
        if (TVar8.kind != Comma || bVar1) goto LAB_001cc7f3;
        local_178._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_168 = local_168 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_178._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        pIVar4 = TVar8.info;
        kind = TVar8.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_001cc7f3;
        }
        TVar6 = current_00.kind;
        uVar7 = TVar8._0_8_ & 0xffffffff;
        current_00.info = pIVar4;
        current_00.kind = (short)uVar7;
        current_00._2_1_ = (char)(uVar7 >> 0x10);
        current_00.numFlags.raw = (char)(uVar7 >> 0x18);
        current_00.rawLen = (int)(uVar7 >> 0x20);
      } while (pIVar5 != pIVar4 || TVar6 != kind);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon>
                        (&this->super_ParserBase,(DiagCode)0x400005,true);
      uVar7 = TVar8._0_8_ & 0xffffffff;
      current_00.kind = (short)uVar7;
      current_00._2_1_ = (char)(uVar7 >> 0x10);
      current_00.numFlags.raw = (char)(uVar7 >> 0x18);
      current_00.rawLen = (int)(uVar7 >> 0x20);
    } while (bVar1);
  }
LAB_001cc7f3:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar5 = semi.info;
LAB_001cc808:
  local_178._8_4_ = 1;
  local_168 = 0;
  uStack_160 = 0;
  local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005e8088;
  local_158 = attributes._M_extent._M_extent_value._M_extent_value;
  local_150 = attributes._M_ptr;
  local_148 = attributes._M_extent._M_extent_value._M_extent_value;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar5);
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_005e8df0;
  attributes_00 = &local_178;
  pCVar3 = slang::syntax::SyntaxFactory::checkerInstantiation
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&attributes_00->_M_first
                      ,type,parameters,
                      (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)&current,
                      semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&attributes_00->_M_first);
  return pCVar3;
}

Assistant:

CheckerInstantiationSyntax& Parser::parseCheckerInstantiation(AttrList attributes) {
    auto& type = parseName(NameOptions::NoClassScope);
    auto parameters = parseParameterValueAssignment();

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.checkerInstantiation(attributes, type, parameters, items.copy(alloc), semi);
}